

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [16];
  undefined4 uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  vint4 bi_2;
  undefined1 auVar25 [64];
  vint4 ai_1;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vint4 ai;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 ai_3;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai_2;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi_7;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi_4;
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  vint4 bi;
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10a8 [16];
  ulong local_1090;
  Intersectors *local_1088;
  size_t local_1080;
  Precalculations *local_1078;
  RayHitK<4> *local_1070;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined4 local_fb8;
  undefined4 uStack_fb4;
  undefined4 uStack_fb0;
  undefined4 uStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1078 = pre;
  local_1088 = This;
  pauVar24 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  local_f88 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_f98._4_4_ = fVar1;
  local_f98._0_4_ = fVar1;
  local_f98._8_4_ = fVar1;
  local_f98._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fa8._4_4_ = fVar2;
  local_fa8._0_4_ = fVar2;
  local_fa8._8_4_ = fVar2;
  local_fa8._12_4_ = fVar2;
  local_fb8 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_fb4 = local_fb8;
  uStack_fb0 = local_fb8;
  uStack_fac = local_fb8;
  local_fc8 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_fc4 = local_fc8;
  uStack_fc0 = local_fc8;
  uStack_fbc = local_fc8;
  local_fd8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1008._4_4_ = fVar3;
  local_1008._0_4_ = fVar3;
  local_1008._8_4_ = fVar3;
  local_1008._12_4_ = fVar3;
  auVar38 = ZEXT1664(local_1008);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1018._4_4_ = fVar4;
  local_1018._0_4_ = fVar4;
  local_1018._8_4_ = fVar4;
  local_1018._12_4_ = fVar4;
  auVar40 = ZEXT1664(local_1018);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1028._4_4_ = fVar5;
  local_1028._0_4_ = fVar5;
  local_1028._8_4_ = fVar5;
  local_1028._12_4_ = fVar5;
  auVar41 = ZEXT1664(local_1028);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar6 = (tray->tnear).field_0.i[k];
  local_1038._4_4_ = iVar6;
  local_1038._0_4_ = iVar6;
  local_1038._8_4_ = iVar6;
  local_1038._12_4_ = iVar6;
  auVar43 = ZEXT1664(local_1038);
  iVar6 = (tray->tfar).field_0.i[k];
  auVar25 = ZEXT1664(CONCAT412(iVar6,CONCAT48(iVar6,CONCAT44(iVar6,iVar6))));
  local_fe8._8_4_ = 0x80000000;
  local_fe8._0_8_ = 0x8000000080000000;
  local_fe8._12_4_ = 0x80000000;
  fStack_f84 = local_f88;
  fStack_f80 = local_f88;
  fStack_f7c = local_f88;
  local_1048._0_4_ = fVar3 * -local_f88;
  local_1048._4_4_ = fVar3 * -local_f88;
  local_1048._8_4_ = fVar3 * -local_f88;
  local_1048._12_4_ = fVar3 * -local_f88;
  auVar45 = ZEXT1664(local_1048);
  local_1058._0_4_ = fVar4 * -fVar1;
  local_1058._4_4_ = fVar4 * -fVar1;
  local_1058._8_4_ = fVar4 * -fVar1;
  local_1058._12_4_ = fVar4 * -fVar1;
  auVar46 = ZEXT1664(local_1058);
  local_1068._0_4_ = fVar5 * -fVar2;
  local_1068._4_4_ = fVar5 * -fVar2;
  local_1068._8_4_ = fVar5 * -fVar2;
  local_1068._12_4_ = fVar5 * -fVar2;
  auVar48 = ZEXT1664(local_1068);
  local_1070 = ray;
  local_1080 = k;
  local_1090 = uVar21;
  uVar22 = uVar21;
LAB_015973a4:
  do {
    if (pauVar24 == (undefined1 (*) [16])&local_f78) {
      return;
    }
    pauVar13 = pauVar24 + -1;
    pauVar24 = pauVar24 + -1;
  } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar13 + 8));
  uVar16 = *(ulong *)*pauVar24;
LAB_015973ce:
  if ((uVar16 & 0xf) == 0) {
    auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar22),auVar45._0_16_,
                              auVar38._0_16_);
    auVar29 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar19),auVar46._0_16_,
                              auVar40._0_16_);
    auVar27 = vpmaxsd_avx(auVar27,auVar29);
    auVar29 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + uVar23),auVar48._0_16_,
                              auVar41._0_16_);
    auVar26 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + (uVar21 ^ 0x10)),auVar45._0_16_
                              ,auVar38._0_16_);
    auVar39 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + (uVar19 ^ 0x10)),auVar46._0_16_
                              ,auVar40._0_16_);
    auVar26 = vpminsd_avx(auVar26,auVar39);
    auVar39 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar16 + 0x20 + (uVar23 ^ 0x10)),auVar48._0_16_
                              ,auVar41._0_16_);
    auVar29 = vpmaxsd_avx(auVar29,auVar43._0_16_);
    local_10a8 = vpmaxsd_avx(auVar27,auVar29);
    auVar27 = vpminsd_avx(auVar39,auVar25._0_16_);
    auVar27 = vpminsd_avx(auVar26,auVar27);
    auVar27 = vpcmpgtd_avx(local_10a8,auVar27);
    uVar14 = vmovmskps_avx(auVar27);
    uVar15 = (ulong)(byte)((byte)uVar14 ^ 0xf);
  }
  else {
    if ((int)(uVar16 & 0xf) != 2) {
      (**(code **)((long)local_1088->leafIntersector +
                  (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40 + 0x10))
                (local_1078,ray,k,context);
      uVar14 = *(undefined4 *)(local_1070 + local_1080 * 4 + 0x80);
      auVar25 = ZEXT1664(CONCAT412(uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))));
      auVar38 = ZEXT1664(local_1008);
      auVar40 = ZEXT1664(local_1018);
      auVar41 = ZEXT1664(local_1028);
      auVar43 = ZEXT1664(local_1038);
      auVar45 = ZEXT1664(local_1048);
      auVar46 = ZEXT1664(local_1058);
      auVar48 = ZEXT1664(local_1068);
      ray = local_1070;
      k = local_1080;
      uVar22 = local_1090;
      goto LAB_015973a4;
    }
    uVar15 = uVar16 & 0xfffffffffffffff0;
    auVar27 = *(undefined1 (*) [16])(uVar15 + 0x80);
    auVar39._0_4_ = local_fd8 * auVar27._0_4_;
    auVar39._4_4_ = fStack_fd4 * auVar27._4_4_;
    auVar39._8_4_ = fStack_fd0 * auVar27._8_4_;
    auVar39._12_4_ = fStack_fcc * auVar27._12_4_;
    auVar29 = *(undefined1 (*) [16])(uVar15 + 0x90);
    auVar42._0_4_ = local_fd8 * auVar29._0_4_;
    auVar42._4_4_ = fStack_fd4 * auVar29._4_4_;
    auVar42._8_4_ = fStack_fd0 * auVar29._8_4_;
    auVar42._12_4_ = fStack_fcc * auVar29._12_4_;
    auVar26 = *(undefined1 (*) [16])(uVar15 + 0xa0);
    auVar44._0_4_ = local_fd8 * auVar26._0_4_;
    auVar44._4_4_ = fStack_fd4 * auVar26._4_4_;
    auVar44._8_4_ = fStack_fd0 * auVar26._8_4_;
    auVar44._12_4_ = fStack_fcc * auVar26._12_4_;
    local_ff8 = *(undefined1 (*) [16])(uVar15 + 0x30);
    auVar10._4_4_ = uStack_fc4;
    auVar10._0_4_ = local_fc8;
    auVar10._8_4_ = uStack_fc0;
    auVar10._12_4_ = uStack_fbc;
    auVar39 = vfmadd231ps_fma(auVar39,auVar10,*(undefined1 (*) [16])(uVar15 + 0x50));
    auVar42 = vfmadd231ps_fma(auVar42,auVar10,*(undefined1 (*) [16])(uVar15 + 0x60));
    auVar11._4_4_ = uStack_fb4;
    auVar11._0_4_ = local_fb8;
    auVar11._8_4_ = uStack_fb0;
    auVar11._12_4_ = uStack_fac;
    auVar37 = vfmadd231ps_fma(auVar39,auVar11,*(undefined1 (*) [16])(uVar15 + 0x20));
    auVar35 = vfmadd231ps_fma(auVar42,auVar11,local_ff8);
    auVar47._8_4_ = 0x7fffffff;
    auVar47._0_8_ = 0x7fffffff7fffffff;
    auVar47._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx(auVar37,auVar47);
    auVar32._8_4_ = 0x219392ef;
    auVar32._0_8_ = 0x219392ef219392ef;
    auVar32._12_4_ = 0x219392ef;
    auVar39 = vcmpps_avx(auVar39,auVar32,1);
    auVar42 = vblendvps_avx(auVar37,auVar32,auVar39);
    auVar39 = vandps_avx(auVar35,auVar47);
    auVar39 = vcmpps_avx(auVar39,auVar32,1);
    auVar37 = vblendvps_avx(auVar35,auVar32,auVar39);
    auVar39 = vfmadd231ps_fma(auVar44,auVar10,*(undefined1 (*) [16])(uVar15 + 0x70));
    auVar35 = vfmadd231ps_fma(auVar39,auVar11,*(undefined1 (*) [16])(uVar15 + 0x40));
    auVar39 = vandps_avx(auVar35,auVar47);
    auVar39 = vcmpps_avx(auVar39,auVar32,1);
    auVar39 = vblendvps_avx(auVar35,auVar32,auVar39);
    auVar35 = vrcpps_avx(auVar42);
    auVar33._8_4_ = 0x3f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    auVar33._12_4_ = 0x3f800000;
    auVar42 = vfnmadd213ps_fma(auVar42,auVar35,auVar33);
    auVar35 = vfmadd132ps_fma(auVar42,auVar35,auVar35);
    auVar42 = vrcpps_avx(auVar37);
    auVar37 = vfnmadd213ps_fma(auVar37,auVar42,auVar33);
    auVar37 = vfmadd132ps_fma(auVar37,auVar42,auVar42);
    auVar42 = vrcpps_avx(auVar39);
    auVar39 = vfnmadd213ps_fma(auVar39,auVar42,auVar33);
    auVar39 = vfmadd132ps_fma(auVar39,auVar42,auVar42);
    auVar27 = vfmadd213ps_fma(auVar27,local_fa8,*(undefined1 (*) [16])(uVar15 + 0xb0));
    auVar29 = vfmadd213ps_fma(auVar29,local_fa8,*(undefined1 (*) [16])(uVar15 + 0xc0));
    auVar42 = vfmadd231ps_fma(auVar27,local_f98,*(undefined1 (*) [16])(uVar15 + 0x50));
    auVar29 = vfmadd231ps_fma(auVar29,local_f98,*(undefined1 (*) [16])(uVar15 + 0x60));
    auVar27 = vfmadd213ps_fma(auVar26,local_fa8,*(undefined1 (*) [16])(uVar15 + 0xd0));
    auVar27 = vfmadd231ps_fma(auVar27,local_f98,*(undefined1 (*) [16])(uVar15 + 0x70));
    auVar12._4_4_ = fStack_f84;
    auVar12._0_4_ = local_f88;
    auVar12._8_4_ = fStack_f80;
    auVar12._12_4_ = fStack_f7c;
    auVar26 = vfmadd231ps_fma(auVar42,auVar12,*(undefined1 (*) [16])(uVar15 + 0x20));
    auVar30._0_4_ = auVar26._0_4_ * (float)((uint)auVar35._0_4_ ^ local_fe8._0_4_);
    auVar30._4_4_ = auVar26._4_4_ * (float)((uint)auVar35._4_4_ ^ local_fe8._4_4_);
    auVar30._8_4_ = auVar26._8_4_ * (float)((uint)auVar35._8_4_ ^ local_fe8._8_4_);
    auVar30._12_4_ = auVar26._12_4_ * (float)((uint)auVar35._12_4_ ^ local_fe8._12_4_);
    auVar29 = vfmadd231ps_fma(auVar29,auVar12,local_ff8);
    auVar28._0_4_ = auVar29._0_4_ * (float)((uint)auVar37._0_4_ ^ local_fe8._0_4_);
    auVar28._4_4_ = auVar29._4_4_ * (float)((uint)auVar37._4_4_ ^ local_fe8._4_4_);
    auVar28._8_4_ = auVar29._8_4_ * (float)((uint)auVar37._8_4_ ^ local_fe8._8_4_);
    auVar28._12_4_ = auVar29._12_4_ * (float)((uint)auVar37._12_4_ ^ local_fe8._12_4_);
    auVar27 = vfmadd231ps_fma(auVar27,auVar12,*(undefined1 (*) [16])(uVar15 + 0x40));
    auVar26._0_4_ = auVar27._0_4_ * (float)((uint)auVar39._0_4_ ^ local_fe8._0_4_);
    auVar26._4_4_ = auVar27._4_4_ * (float)((uint)auVar39._4_4_ ^ local_fe8._4_4_);
    auVar26._8_4_ = auVar27._8_4_ * (float)((uint)auVar39._8_4_ ^ local_fe8._8_4_);
    auVar26._12_4_ = auVar27._12_4_ * (float)((uint)auVar39._12_4_ ^ local_fe8._12_4_);
    auVar34._0_4_ = auVar35._0_4_ + auVar30._0_4_;
    auVar34._4_4_ = auVar35._4_4_ + auVar30._4_4_;
    auVar34._8_4_ = auVar35._8_4_ + auVar30._8_4_;
    auVar34._12_4_ = auVar35._12_4_ + auVar30._12_4_;
    auVar35._0_4_ = auVar37._0_4_ + auVar28._0_4_;
    auVar35._4_4_ = auVar37._4_4_ + auVar28._4_4_;
    auVar35._8_4_ = auVar37._8_4_ + auVar28._8_4_;
    auVar35._12_4_ = auVar37._12_4_ + auVar28._12_4_;
    auVar37._0_4_ = auVar39._0_4_ + auVar26._0_4_;
    auVar37._4_4_ = auVar39._4_4_ + auVar26._4_4_;
    auVar37._8_4_ = auVar39._8_4_ + auVar26._8_4_;
    auVar37._12_4_ = auVar39._12_4_ + auVar26._12_4_;
    auVar27 = vpminsd_avx(auVar28,auVar35);
    auVar29 = vpminsd_avx(auVar26,auVar37);
    auVar27 = vmaxps_avx(auVar27,auVar29);
    auVar42 = vpminsd_avx(auVar30,auVar34);
    auVar39 = vpmaxsd_avx(auVar30,auVar34);
    auVar29 = vpmaxsd_avx(auVar28,auVar35);
    auVar26 = vpmaxsd_avx(auVar26,auVar37);
    auVar26 = vminps_avx(auVar29,auVar26);
    auVar43 = ZEXT1664(local_1038);
    auVar29 = vmaxps_avx(local_1038,auVar42);
    local_10a8 = vmaxps_avx(auVar29,auVar27);
    auVar27 = vminps_avx(auVar25._0_16_,auVar39);
    auVar27 = vminps_avx(auVar27,auVar26);
    auVar27 = vcmpps_avx(local_10a8,auVar27,2);
    uVar14 = vmovmskps_avx(auVar27);
    uVar15 = CONCAT44((int)(uVar15 >> 0x20),uVar14);
    auVar38 = ZEXT1664(local_1008);
    auVar40 = ZEXT1664(local_1018);
    auVar41 = ZEXT1664(local_1028);
    auVar45 = ZEXT1664(local_1048);
    auVar46 = ZEXT1664(local_1058);
    auVar48 = ZEXT1664(local_1068);
  }
  if (uVar15 == 0) goto LAB_015973a4;
  uVar20 = uVar16 & 0xfffffffffffffff0;
  lVar9 = 0;
  for (uVar16 = uVar15; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
    lVar9 = lVar9 + 1;
  }
  uVar17 = (uint)uVar15 - 1 & (uint)uVar15;
  uVar15 = (ulong)uVar17;
  uVar16 = *(ulong *)(uVar20 + lVar9 * 8);
  if (uVar17 != 0) {
    uVar7 = *(uint *)(local_10a8 + lVar9 * 4);
    lVar9 = 0;
    for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
      lVar9 = lVar9 + 1;
    }
    uVar17 = uVar17 - 1 & uVar17;
    uVar18 = (ulong)uVar17;
    uVar15 = *(ulong *)(uVar20 + lVar9 * 8);
    uVar8 = *(uint *)(local_10a8 + lVar9 * 4);
    if (uVar17 == 0) {
      if (uVar7 < uVar8) {
        *(ulong *)*pauVar24 = uVar15;
        *(uint *)(*pauVar24 + 8) = uVar8;
        pauVar24 = pauVar24 + 1;
      }
      else {
        *(ulong *)*pauVar24 = uVar16;
        *(uint *)(*pauVar24 + 8) = uVar7;
        uVar16 = uVar15;
        pauVar24 = pauVar24 + 1;
      }
    }
    else {
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar16;
      auVar27 = vpunpcklqdq_avx(auVar27,ZEXT416(uVar7));
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar15;
      auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar8));
      lVar9 = 0;
      for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar9 = lVar9 + 1;
      }
      uVar17 = uVar17 - 1 & uVar17;
      uVar16 = (ulong)uVar17;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(uVar20 + lVar9 * 8);
      auVar39 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_10a8 + lVar9 * 4)));
      auVar26 = vpcmpgtd_avx(auVar29,auVar27);
      if (uVar17 == 0) {
        auVar42 = vpshufd_avx(auVar26,0xaa);
        auVar26 = vblendvps_avx(auVar29,auVar27,auVar42);
        auVar27 = vblendvps_avx(auVar27,auVar29,auVar42);
        auVar29 = vpcmpgtd_avx(auVar39,auVar26);
        auVar42 = vpshufd_avx(auVar29,0xaa);
        auVar29 = vblendvps_avx(auVar39,auVar26,auVar42);
        auVar26 = vblendvps_avx(auVar26,auVar39,auVar42);
        auVar39 = vpcmpgtd_avx(auVar26,auVar27);
        auVar42 = vpshufd_avx(auVar39,0xaa);
        auVar39 = vblendvps_avx(auVar26,auVar27,auVar42);
        auVar27 = vblendvps_avx(auVar27,auVar26,auVar42);
        *pauVar24 = auVar27;
        pauVar24[1] = auVar39;
        uVar16 = auVar29._0_8_;
        pauVar24 = pauVar24 + 2;
      }
      else {
        lVar9 = 0;
        for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
          lVar9 = lVar9 + 1;
        }
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(uVar20 + lVar9 * 8);
        auVar37 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_10a8 + lVar9 * 4)));
        auVar42 = vpshufd_avx(auVar26,0xaa);
        auVar26 = vblendvps_avx(auVar29,auVar27,auVar42);
        auVar27 = vblendvps_avx(auVar27,auVar29,auVar42);
        auVar29 = vpcmpgtd_avx(auVar37,auVar39);
        auVar42 = vpshufd_avx(auVar29,0xaa);
        auVar29 = vblendvps_avx(auVar37,auVar39,auVar42);
        auVar39 = vblendvps_avx(auVar39,auVar37,auVar42);
        auVar42 = vpcmpgtd_avx(auVar39,auVar27);
        auVar37 = vpshufd_avx(auVar42,0xaa);
        auVar42 = vblendvps_avx(auVar39,auVar27,auVar37);
        auVar27 = vblendvps_avx(auVar27,auVar39,auVar37);
        auVar39 = vpcmpgtd_avx(auVar29,auVar26);
        auVar37 = vpshufd_avx(auVar39,0xaa);
        auVar39 = vblendvps_avx(auVar29,auVar26,auVar37);
        auVar29 = vblendvps_avx(auVar26,auVar29,auVar37);
        auVar26 = vpcmpgtd_avx(auVar42,auVar29);
        auVar37 = vpshufd_avx(auVar26,0xaa);
        auVar26 = vblendvps_avx(auVar42,auVar29,auVar37);
        auVar29 = vblendvps_avx(auVar29,auVar42,auVar37);
        *pauVar24 = auVar27;
        pauVar24[1] = auVar29;
        pauVar24[2] = auVar26;
        uVar16 = auVar39._0_8_;
        pauVar24 = pauVar24 + 3;
      }
    }
  }
  goto LAB_015973ce;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }